

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O2

StringView __thiscall Corrade::Containers::String::findLast(String *this,StringView substring)

{
  BasicStringView<const_char> BVar1;
  StringView SVar2;
  BasicStringView<const_char> BStack_28;
  
  BasicStringView<const_char>::BasicStringView<const_char,_0>(&BStack_28,this);
  BVar1 = BasicStringView<const_char>::findLastOr(&BStack_28,substring,(char *)0x0);
  SVar2._data = BVar1._data;
  SVar2._sizePlusFlags = BVar1._sizePlusFlags;
  return SVar2;
}

Assistant:

StringView String::findLast(const StringView substring) const {
    /* Calling straight into the concrete implementation to reduce call stack
       depth */
    return StringView{*this}.findLastOr(substring, nullptr);
}